

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job.c
# Opt level: O1

void push_job(parse_t *ps)

{
  job_t *pjVar1;
  code *pcVar2;
  size_t sVar3;
  UT_array *pUVar4;
  ctor_f *pcVar5;
  char *pcVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  
  if (ps->job->name == (char *)0x0) {
    utstring_printf(ps->em,"job has no name");
    ps->rc = -1;
  }
  if (ps->rc != -1) {
    pjVar1 = ps->job;
    uVar8 = (pjVar1->cmdv).i + 1;
    if ((pjVar1->cmdv).n < uVar8) {
      uVar7 = (pjVar1->cmdv).n;
      if (uVar7 < uVar8) {
        do {
          bVar9 = uVar7 == 0;
          uVar7 = uVar7 * 2;
          if (bVar9) {
            uVar7 = 8;
          }
        } while (uVar7 < uVar8);
        (pjVar1->cmdv).n = uVar7;
      }
      pcVar6 = (char *)realloc((pjVar1->cmdv).d,(ulong)uVar7 * (pjVar1->cmdv).icd.sz);
      (ps->job->cmdv).d = pcVar6;
      if (pcVar6 == (char *)0x0) goto LAB_00104b74;
    }
    pjVar1 = ps->job;
    pcVar2 = (code *)(pjVar1->cmdv).icd.init;
    sVar3 = (pjVar1->cmdv).icd.sz;
    if (pcVar2 == (code *)0x0) {
      memset((pjVar1->cmdv).d + (pjVar1->cmdv).i * sVar3,0,sVar3);
    }
    else {
      (*pcVar2)();
    }
    pUVar4 = &ps->job->cmdv;
    pUVar4->i = pUVar4->i + 1;
    pUVar4 = ps->cfg->jobs;
    uVar8 = pUVar4->i + 1;
    if (pUVar4->n < uVar8) {
      uVar7 = pUVar4->n;
      if (uVar7 < uVar8) {
        do {
          bVar9 = uVar7 == 0;
          uVar7 = uVar7 * 2;
          if (bVar9) {
            uVar7 = 8;
          }
        } while (uVar7 < uVar8);
        pUVar4->n = uVar7;
      }
      pcVar6 = (char *)realloc(pUVar4->d,(ulong)uVar7 * (pUVar4->icd).sz);
      ps->cfg->jobs->d = pcVar6;
      if (pcVar6 == (char *)0x0) {
LAB_00104b74:
        exit(-1);
      }
    }
    pUVar4 = ps->cfg->jobs;
    sVar3 = (pUVar4->icd).sz;
    uVar8 = pUVar4->i;
    pcVar5 = (pUVar4->icd).copy;
    pUVar4->i = uVar8 + 1;
    if (pcVar5 == (ctor_f *)0x0) {
      memcpy(pUVar4->d + uVar8 * sVar3,ps->job,sVar3);
    }
    else {
      (*pcVar5)(pUVar4->d + uVar8 * sVar3,ps->job);
    }
    job_fin(ps->job);
    pjVar1 = ps->job;
    memset(pjVar1,0,0x218);
    (pjVar1->cmdv).icd.sz = 8;
    (pjVar1->cmdv).icd.init = (undefined1 *)0x0;
    (pjVar1->cmdv).icd.copy = utarray_str_cpy;
    (pjVar1->cmdv).icd.dtor = utarray_str_dtor;
    (pjVar1->envv).icd.dtor = (undefined1 *)0x0;
    (pjVar1->envv).d = (char *)0x0;
    (pjVar1->envv).icd.init = (undefined1 *)0x0;
    (pjVar1->envv).icd.copy = (ctor_f *)0x0;
    (pjVar1->envv).i = 0;
    (pjVar1->envv).n = 0;
    (pjVar1->envv).icd.sz = 0;
    (pjVar1->envv).icd.copy = utarray_str_cpy;
    (pjVar1->envv).icd.dtor = utarray_str_dtor;
    (pjVar1->envv).icd.sz = 8;
    (pjVar1->envv).icd.init = (undefined1 *)0x0;
    (pjVar1->depv).icd.dtor = (undefined1 *)0x0;
    (pjVar1->depv).d = (char *)0x0;
    (pjVar1->depv).icd.init = (undefined1 *)0x0;
    (pjVar1->depv).icd.copy = (ctor_f *)0x0;
    (pjVar1->depv).i = 0;
    (pjVar1->depv).n = 0;
    (pjVar1->depv).icd.sz = 0;
    (pjVar1->depv).icd.copy = utarray_str_cpy;
    (pjVar1->depv).icd.dtor = utarray_str_dtor;
    (pjVar1->depv).icd.sz = 8;
    (pjVar1->depv).icd.init = (undefined1 *)0x0;
    (pjVar1->rlim).icd.dtor = (undefined1 *)0x0;
    (pjVar1->rlim).d = (char *)0x0;
    (pjVar1->rlim).icd.init = (undefined1 *)0x0;
    (pjVar1->rlim).icd.copy = (ctor_f *)0x0;
    (pjVar1->rlim).i = 0;
    (pjVar1->rlim).n = 0;
    (pjVar1->rlim).icd.sz = 0;
    (pjVar1->rlim).icd.copy = (ctor_f *)0x0;
    (pjVar1->rlim).icd.dtor = (undefined1 *)0x0;
    (pjVar1->rlim).icd.sz = 0x18;
    (pjVar1->rlim).icd.init = (undefined1 *)0x0;
    (pjVar1->cpuset).__bits[0xe] = 0;
    (pjVar1->cpuset).__bits[0xf] = 0;
    (pjVar1->cpuset).__bits[0xc] = 0;
    (pjVar1->cpuset).__bits[0xd] = 0;
    (pjVar1->cpuset).__bits[10] = 0;
    (pjVar1->cpuset).__bits[0xb] = 0;
    (pjVar1->cpuset).__bits[8] = 0;
    (pjVar1->cpuset).__bits[9] = 0;
    (pjVar1->cpuset).__bits[6] = 0;
    (pjVar1->cpuset).__bits[7] = 0;
    (pjVar1->cpuset).__bits[4] = 0;
    (pjVar1->cpuset).__bits[5] = 0;
    (pjVar1->cpuset).__bits[2] = 0;
    (pjVar1->cpuset).__bits[3] = 0;
    (pjVar1->cpuset).__bits[0] = 0;
    (pjVar1->cpuset).__bits[1] = 0;
    pjVar1->respawn = 1;
  }
  return;
}

Assistant:

void push_job(parse_t *ps) {

  /* final validation */
  if (!ps->job->name) {
      utstring_printf(ps->em, "job has no name");
      ps->rc = -1;
  }

  if (ps->rc == -1) return;

  /* okay. polish it off and copy it into the jobs */
  utarray_extend_back(&ps->job->cmdv); /* put NULL on end of argv */
  utarray_push_back(ps->cfg->jobs, ps->job);
  /* reset job for another parse */
  job_fin(ps->job); 
  job_ini(ps->job);
}